

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

int __thiscall
re2::Regexp::Walker<int>::WalkInternal(Walker<int> *this,Regexp *re,int top_arg,bool use_copy)

{
  stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
  *psVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  int *piVar6;
  size_type sVar7;
  WalkState<int> local_220;
  Regexp **local_200;
  Regexp **sub;
  Regexp *pRStack_1f0;
  bool stop;
  Regexp *re_1;
  reference pvStack_1e0;
  int t;
  WalkState<int> *s;
  LogMessage local_1a8;
  byte local_25;
  int local_24;
  bool use_copy_local;
  Regexp *pRStack_20;
  int top_arg_local;
  Regexp *re_local;
  Walker<int> *this_local;
  
  local_25 = use_copy;
  local_24 = top_arg;
  pRStack_20 = re;
  re_local = (Regexp *)this;
  Reset(this);
  if (pRStack_20 == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0xa0);
    poVar4 = LogMessage::stream(&local_1a8);
    std::operator<<(poVar4,"Walk NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a8);
    return local_24;
  }
  psVar1 = this->stack_;
  WalkState<int>::WalkState((WalkState<int> *)&s,pRStack_20,local_24);
  std::
  stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
  ::push(psVar1,(value_type *)&s);
  do {
    while( true ) {
      pvStack_1e0 = std::
                    stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                    ::top(this->stack_);
      pRStack_1f0 = pvStack_1e0->re;
      if (pvStack_1e0->n != -1) break;
      iVar3 = this->max_visits_ + -1;
      this->max_visits_ = iVar3;
      if (iVar3 < 0) {
        this->stopped_early_ = true;
        re_1._4_4_ = (*this->_vptr_Walker[5])(this,pRStack_1f0,(ulong)(uint)pvStack_1e0->parent_arg)
        ;
      }
      else {
        sub._7_1_ = 0;
        iVar3 = (*this->_vptr_Walker[2])
                          (this,pRStack_1f0,(ulong)(uint)pvStack_1e0->parent_arg,(long)&sub + 7);
        pvStack_1e0->pre_arg = iVar3;
        if ((sub._7_1_ & 1) == 0) {
          pvStack_1e0->n = 0;
          pvStack_1e0->child_args = (int *)0x0;
          if (pRStack_1f0->nsub_ == 1) {
            pvStack_1e0->child_args = &pvStack_1e0->child_arg;
          }
          else if (1 < pRStack_1f0->nsub_) {
            auVar2 = ZEXT216(pRStack_1f0->nsub_) * ZEXT816(4);
            uVar5 = auVar2._0_8_;
            if (auVar2._8_8_ != 0) {
              uVar5 = 0xffffffffffffffff;
            }
            piVar6 = (int *)operator_new__(uVar5);
            pvStack_1e0->child_args = piVar6;
          }
          break;
        }
        re_1._4_4_ = pvStack_1e0->pre_arg;
      }
LAB_0012a408:
      std::
      stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
      ::pop(this->stack_);
      sVar7 = std::
              stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
              ::size(this->stack_);
      if (sVar7 == 0) {
        return re_1._4_4_;
      }
      pvStack_1e0 = std::
                    stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                    ::top(this->stack_);
      if (pvStack_1e0->child_args == (int *)0x0) {
        pvStack_1e0->child_arg = re_1._4_4_;
      }
      else {
        pvStack_1e0->child_args[pvStack_1e0->n] = re_1._4_4_;
      }
      pvStack_1e0->n = pvStack_1e0->n + 1;
    }
    if ((pRStack_1f0->nsub_ == 0) ||
       (local_200 = Regexp::sub(pRStack_1f0), (int)(uint)pRStack_1f0->nsub_ <= pvStack_1e0->n)) {
      re_1._4_4_ = (*this->_vptr_Walker[3])
                             (this,pRStack_1f0,(ulong)(uint)pvStack_1e0->parent_arg,
                              (ulong)(uint)pvStack_1e0->pre_arg,pvStack_1e0->child_args,
                              (ulong)(uint)pvStack_1e0->n);
      if ((1 < pRStack_1f0->nsub_) && (pvStack_1e0->child_args != (int *)0x0)) {
        operator_delete__(pvStack_1e0->child_args);
      }
      goto LAB_0012a408;
    }
    if (((local_25 & 1) == 0) ||
       ((pvStack_1e0->n < 1 || (local_200[pvStack_1e0->n + -1] != local_200[pvStack_1e0->n])))) {
      psVar1 = this->stack_;
      WalkState<int>::WalkState(&local_220,local_200[pvStack_1e0->n],pvStack_1e0->pre_arg);
      std::
      stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
      ::push(psVar1,&local_220);
    }
    else {
      iVar3 = (*this->_vptr_Walker[4])
                        (this,(ulong)(uint)pvStack_1e0->child_args[pvStack_1e0->n + -1]);
      pvStack_1e0->child_args[pvStack_1e0->n] = iVar3;
      pvStack_1e0->n = pvStack_1e0->n + 1;
    }
  } while( true );
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        // Fall through.
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}